

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-inquire.c
# Opt level: O2

int main(int argc,char **argv)

{
  Boolean BVar1;
  MA_AccessIndex index [10];
  Integer handle [10];
  
  BVar1 = MA_init(0x3ec,20000,50000);
  if (BVar1 != 0) {
    printf("# initialized heap = %ld, stack = %ld\n",50000,20000);
    puts("# should see roughly the following values:");
    puts("#  MA_inquire_heap(MT_DBL)               = 50K");
    puts("#  MA_inquire_heap_check_stack(MT_DBL)   = 50K");
    puts("#  MA_inquire_heap_no_partition(MT_DBL)  = 70K");
    puts("#  MA_inquire_stack(MT_DBL)              = 20K");
    puts("#  MA_inquire_stack_check_heap(MT_DBL)   = 20K");
    puts("#  MA_inquire_stack_no_partition(MT_DBL) = 70K");
    print_inquire();
    puts("# allocate 2 heap (10K, 20K), 1 stack (35K)");
    MA_alloc_get(0x3ec,10000,"heap0",handle,index);
    MA_alloc_get(0x3ec,20000,"heap1",handle + 1,index + 1);
    MA_push_get(0x3ec,35000,"stack0",handle + 2,index + 2);
    puts("# free 1 heap (10K)");
    MA_free_heap(handle[0]);
    puts("# should see roughly the following values:");
    puts("#  MA_inquire_heap(MT_DBL)               = 20K");
    puts("#  MA_inquire_heap_check_stack(MT_DBL)   = 10K");
    puts("#  MA_inquire_heap_no_partition(MT_DBL)  = 10K");
    puts("#  MA_inquire_stack(MT_DBL)              = 0");
    puts("#  MA_inquire_stack_check_heap(MT_DBL)   = 0");
    puts("#  MA_inquire_stack_no_partition(MT_DBL) = 5K");
    print_inquire();
    return 0;
  }
  fwrite("MA_init failed; punting\n",0x18,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    Integer        units_heap;
    Integer        units_stack;
    Boolean        ok;
                  
    Integer        handle[MAXHANDLES];
    MA_AccessIndex index[MAXHANDLES];

    /* set sizes of heap and stack */
    units_heap = 50000;
    units_stack = 20000;

    /* initialize */
    ok = MA_init(MT_DBL, units_stack, units_heap);
    if (!ok)
    {
        (void)fprintf(stderr, "MA_init failed; punting\n");
        exit(1);
    }

    printf("# initialized heap = %ld, stack = %ld\n",
            (long)units_heap, (long)units_stack);

    printf("# should see roughly the following values:\n");
    printf("#  MA_inquire_heap(MT_DBL)               = 50K\n");
    printf("#  MA_inquire_heap_check_stack(MT_DBL)   = 50K\n");
    printf("#  MA_inquire_heap_no_partition(MT_DBL)  = 70K\n");
    printf("#  MA_inquire_stack(MT_DBL)              = 20K\n");
    printf("#  MA_inquire_stack_check_heap(MT_DBL)   = 20K\n");
    printf("#  MA_inquire_stack_no_partition(MT_DBL) = 70K\n");

    print_inquire();

    printf("# allocate 2 heap (10K, 20K), 1 stack (35K)\n");
    MA_alloc_get(MT_DBL, 10000, "heap0", &handle[0], &index[0]);
    MA_alloc_get(MT_DBL, 20000, "heap1", &handle[1], &index[1]);
    MA_push_get(MT_DBL, 35000, "stack0", &handle[2], &index[2]);

    printf("# free 1 heap (10K)\n");
    MA_free_heap(handle[0]);

    printf("# should see roughly the following values:\n");
    printf("#  MA_inquire_heap(MT_DBL)               = 20K\n");
    printf("#  MA_inquire_heap_check_stack(MT_DBL)   = 10K\n");
    printf("#  MA_inquire_heap_no_partition(MT_DBL)  = 10K\n");
    printf("#  MA_inquire_stack(MT_DBL)              = 0\n");
    printf("#  MA_inquire_stack_check_heap(MT_DBL)   = 0\n");
    printf("#  MA_inquire_stack_no_partition(MT_DBL) = 5K\n");

    print_inquire();

    return 0;
}